

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Const::From<unsigned_char>(Const *this,Type type,uchar data,int lane)

{
  if (lane + 1U < 0x11) {
    this->type_ = type;
    v128::From<unsigned_char>(&this->data_,lane,data);
    if (lane < 4) {
      this->nan_[lane] = None;
    }
    return;
  }
  __assert_fail("(lane + 1) * sizeof(T) <= sizeof(data_)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                ,0xc1,"void wabt::Const::From(Type, T, int) [T = unsigned char]");
}

Assistant:

void From(Type type, T data, int lane = 0) {
    static_assert(sizeof(T) <= sizeof(data_), "Invalid cast!");
    assert((lane + 1) * sizeof(T) <= sizeof(data_));
    type_ = type;
    data_.From<T>(lane, data);
    set_expected_nan(lane, ExpectedNan::None);
  }